

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O1

TransactionController * __thiscall
cfd::api::TransactionApi::FundRawTransaction
          (TransactionController *__return_storage_ptr__,TransactionApi *this,string *tx_hex,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos,Amount *target_value,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *selected_txin_utxos,
          string *reserve_txout_address,double effective_fee_rate,Amount *estimate_fee,
          UtxoFilter *filter,CoinSelectionOption *option_params,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *append_txout_addresses,NetType_conflict net_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list,Amount *calculate_fee)

{
  uint32_t uVar1;
  uint32_t uVar2;
  pointer pUVar3;
  Txid *pTVar4;
  undefined8 uVar5;
  pointer pTVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  value_type_conflict *__val;
  Transaction *this_00;
  uint64_t uVar10;
  CfdException *pCVar11;
  pointer pTVar12;
  Txid *txid;
  pointer pUVar13;
  CoinSelectionOption *this_01;
  string *__return_storage_ptr___00;
  TxOutReference *txout;
  AbstractTransaction *pAVar14;
  pointer pTVar15;
  undefined1 auVar16 [8];
  Amount AVar17;
  TransactionController *txc;
  CoinSelection coin_select;
  int64_t new_txout_satoshi;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_bytes;
  Amount txin_total_amount;
  Amount target_amount;
  Amount txout_amount;
  Amount txin_amount;
  UtxoFilter utxo_filter;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxodata_list;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> matched_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> new_selected_utxos;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxo_list;
  AddressFactory_conflict addr_factory;
  CoinSelectionOption option;
  Address reserve_address;
  value_type *local_5a8;
  Amount local_598;
  undefined1 local_588 [8];
  int local_580;
  undefined4 uStack_57c;
  undefined1 local_578 [32];
  undefined1 local_558 [32];
  uint local_538;
  pointer local_530;
  double local_508;
  pointer local_500;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4f8;
  Amount local_4d8;
  Amount local_4c8;
  string *local_4b0;
  pointer local_4a8;
  Amount local_4a0;
  Amount local_490;
  Amount local_480;
  UtxoFilter local_46c;
  undefined1 local_468 [16];
  _func_int *local_458 [2];
  Amount local_448;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_438;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_420;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_408;
  Amount *local_3f0;
  Amount local_3e8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_3d8;
  Amount local_3c0;
  ByteData256 local_3b0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_398;
  AddressFactory local_380;
  CoinSelectionOption local_358;
  Amount local_2e8;
  undefined1 local_2d8 [32];
  AddressFormatData local_2b8;
  pointer local_278;
  TapBranch local_260;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1e8;
  Script local_1d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  TxOutReference local_160;
  TxOutReference local_110;
  AbstractTxInReference local_c0;
  
  local_578._24_8_ = __return_storage_ptr__;
  local_508 = effective_fee_rate;
  local_4b0 = tx_hex;
  CoinSelectionOption::CoinSelectionOption(&local_358);
  if (filter != (UtxoFilter *)0x0) {
    local_46c = (UtxoFilter)filter->reserved;
  }
  if (option_params == (CoinSelectionOption *)0x0) {
    CoinSelectionOption::InitializeTxSizeInfo(&local_358);
    CoinSelectionOption::SetEffectiveFeeBaserate(&local_358,local_508);
    CoinSelectionOption::SetLongTermFeeBaserate(&local_358,local_508);
  }
  else {
    local_358.has_ignore_fee_asset_ = option_params->has_ignore_fee_asset_;
    local_358.use_bnb_ = option_params->use_bnb_;
    local_358._1_3_ = *(undefined3 *)&option_params->field_0x1;
    local_358.change_output_size_ = option_params->change_output_size_;
    local_358.change_spend_size_ = option_params->change_spend_size_;
    local_358._12_4_ = *(undefined4 *)&option_params->field_0xc;
    local_358.effective_fee_baserate_ = option_params->effective_fee_baserate_;
    local_358.long_term_fee_baserate_ = option_params->long_term_fee_baserate_;
    local_358.knapsack_minimum_change_ = option_params->knapsack_minimum_change_;
    local_358.dust_fee_rate_ = option_params->dust_fee_rate_;
    core::ConfidentialAssetId::operator=(&local_358.fee_asset_,&option_params->fee_asset_);
    local_358.exponent_ = option_params->exponent_;
    local_358.minimum_bits_ = option_params->minimum_bits_;
  }
  AddressFactory::AddressFactory(&local_380,net_type);
  if (prefix_list !=
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    AddressFactory::AddressFactory((AddressFactory *)local_2d8,net_type,prefix_list);
    local_380.type_ = local_2d8._8_4_;
    local_380.wit_ver_ = local_2d8._12_4_;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_380.prefix_list_,
              (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_2d8 + 0x10));
    local_2d8._0_8_ = &PTR__AddressFactory_00733578;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            (local_2d8 + 0x10));
  }
  AddressFactory::GetAddress((Address *)local_2d8,&local_380,reserve_txout_address);
  bVar7 = AddressFactory::CheckAddressNetType(&local_380,(Address *)local_2d8,net_type);
  if (!bVar7) {
    local_558._0_8_ = "cfdapi_transaction.cpp";
    local_558._8_4_ = 0x146;
    local_558._16_8_ = "FundRawTransaction";
    local_588._0_4_ = local_2d8._0_4_;
    core::logger::log<std::__cxx11::string_const&,cfd::core::NetType&,cfd::core::NetType&>
              ((CfdSourceLocation *)local_558,kCfdLogLevelWarning,
               "Failed to FundRawTransaction. Input address and network is unmatch.: address=[{}], input_net_type=[{}], parsed_net_type=[{}]"
               ,reserve_txout_address,&net_type,(anon_enum_32 *)local_588);
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    local_558._0_8_ = local_558 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_558,
               "Failed to FundRawTransaction. Input address and network is unmatch.","");
    core::CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_558);
    __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  TransactionController::TransactionController((TransactionController *)local_578._24_8_,local_4b0);
  this_00 = TransactionController::GetTransaction((TransactionController *)local_578._24_8_);
  core::Amount::Amount(&local_480);
  core::Amount::Amount(&local_490);
  local_4a8 = (pointer)utxos;
  local_3f0 = target_value;
  core::Transaction::GetTxOutList
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             local_558,this_00);
  uVar5 = local_558._8_8_;
  if (local_558._0_8_ != local_558._8_8_) {
    pAVar14 = (AbstractTransaction *)local_558._0_8_;
    do {
      local_588 = (undefined1  [8])((Amount *)&pAVar14->wally_tx_pointer_)->amount_;
      local_580 = CONCAT31(local_580._1_3_,*(bool *)&pAVar14[1]._vptr_AbstractTransaction);
      core::Amount::operator+=(&local_490,(Amount *)local_588);
      pAVar14 = pAVar14 + 5;
    } while (pAVar14 != (AbstractTransaction *)uVar5);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             local_558);
  local_408.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::reserve
            (&local_408,
             ((long)(selected_txin_utxos->
                    super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(selected_txin_utxos->
                    super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 4) * -0x6474a8819ec8e951);
  core::Transaction::GetTxInList(&local_420,this_00);
  local_5a8 = (selected_txin_utxos->
              super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pUVar3 = (selected_txin_utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_5a8 != pUVar3) {
    do {
      pTVar6 = local_420.
               super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_420.
          super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_420.
          super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pTVar15 = local_420.
                  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          core::Txid::Txid((Txid *)local_558,&(pTVar15->super_AbstractTxInReference).txid_);
          bVar7 = core::Txid::Equals((Txid *)local_558,&local_5a8->txid);
          if (bVar7) {
            uVar1 = local_5a8->vout;
            uVar2 = (pTVar15->super_AbstractTxInReference).vout_;
            local_558._0_8_ = &PTR__Txid_00735400;
            if ((AbstractTransaction *)local_558._8_8_ != (AbstractTransaction *)0x0) {
              operator_delete((void *)local_558._8_8_);
            }
            if (uVar1 == uVar2) {
              core::Amount::operator+=(&local_480,&local_5a8->amount);
              std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                        (&local_408,local_5a8);
              break;
            }
          }
          else {
            local_558._0_8_ = &PTR__Txid_00735400;
            if ((AbstractTransaction *)local_558._8_8_ != (AbstractTransaction *)0x0) {
              operator_delete((void *)local_558._8_8_);
            }
          }
          pTVar15 = pTVar15 + 1;
        } while (pTVar15 != pTVar6);
      }
      local_5a8 = local_5a8 + 1;
    } while (local_5a8 != pUVar3);
  }
  pUVar3 = local_4a8;
  local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::reserve
            (&local_438,
             ((long)(((_Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     &local_4a8->block_height)->_M_impl).super__Vector_impl_data._M_finish -
              (long)(((_Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     &local_4a8->block_height)->_M_impl).super__Vector_impl_data._M_start >> 4) *
             -0x6474a8819ec8e951);
  local_5a8 = (((_Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&pUVar3->block_height
               )->_M_impl).super__Vector_impl_data._M_start;
  local_4a8 = (((_Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&pUVar3->block_height
               )->_M_impl).super__Vector_impl_data._M_finish;
  if (local_5a8 != local_4a8) {
    do {
      pTVar6 = local_420.
               super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_420.
          super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_420.
          super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_003c0bb2:
        std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back(&local_438,local_5a8);
      }
      else {
        pTVar15 = local_420.
                  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar7 = false;
        do {
          pTVar12 = pTVar15 + 1;
          core::Txid::Txid((Txid *)local_558,&(pTVar15->super_AbstractTxInReference).txid_);
          bVar8 = core::Txid::Equals((Txid *)local_558,&local_5a8->txid);
          if (bVar8) {
            uVar1 = local_5a8->vout;
            uVar2 = (pTVar15->super_AbstractTxInReference).vout_;
            local_558._0_8_ = &PTR__Txid_00735400;
            if ((AbstractTransaction *)local_558._8_8_ != (AbstractTransaction *)0x0) {
              operator_delete((void *)local_558._8_8_);
            }
            bVar9 = true;
            bVar8 = true;
            if (uVar1 != uVar2) goto LAB_003c0b8f;
          }
          else {
            local_558._0_8_ = &PTR__Txid_00735400;
            if ((AbstractTransaction *)local_558._8_8_ != (AbstractTransaction *)0x0) {
              operator_delete((void *)local_558._8_8_);
            }
LAB_003c0b8f:
            bVar8 = false;
            bVar9 = bVar7;
          }
        } while ((!bVar8) && (pTVar15 = pTVar12, bVar7 = bVar9, pTVar12 != pTVar6));
        if (!bVar9) goto LAB_003c0bb2;
      }
      local_5a8 = local_5a8 + 1;
    } while (local_5a8 != local_4a8);
  }
  core::Amount::Amount(&local_598);
  this_01 = &local_358;
  uVar10 = CoinSelectionOption::GetEffectiveFeeBaserate(this_01);
  if (uVar10 != 0) {
    AVar17 = EstimateFee((TransactionApi *)this_01,local_4b0,&local_408,(Amount *)0x0,(Amount *)0x0,
                         local_508);
    local_598.amount_ = AVar17.amount_;
    local_598.ignore_check_ = AVar17.ignore_check_;
    local_558._0_8_ = "cfdapi_transaction.cpp";
    local_558._8_4_ = 0x17d;
    local_558._16_8_ = "FundRawTransaction";
    local_588 = (undefined1  [8])core::Amount::GetSatoshiValue(&local_598);
    core::logger::log<long&>
              ((CfdSourceLocation *)local_558,kCfdLogLevelInfo,
               "FundRawTransaction: pre estimation fee=[{}]",(long *)local_588);
  }
  core::Amount::Amount(&local_448);
  local_4c8.amount_ = local_3f0->amount_;
  local_4c8._8_8_ = *(undefined8 *)&local_3f0->ignore_check_;
  bVar7 = core::operator>(&local_480,&local_490);
  if (bVar7) {
    AVar17 = core::operator-(&local_480,&local_490);
    local_448.amount_ = AVar17.amount_;
    local_448.ignore_check_ = AVar17.ignore_check_;
    bVar7 = core::operator<(&local_448,&local_4c8);
    if (bVar7) {
      core::Amount::operator-=(&local_4c8,&local_448);
    }
  }
  else {
    bVar7 = core::operator<(&local_480,&local_490);
    if (bVar7) {
      AVar17 = core::operator-(&local_490,&local_480);
      local_448.amount_ = AVar17.amount_;
      local_448.ignore_check_ = AVar17.ignore_check_;
      core::Amount::operator+=(&local_4c8,&local_448);
    }
  }
  UtxoUtil::ConvertToUtxo(&local_398,&local_438);
  local_4d8.amount_ = local_480.amount_;
  local_4d8.ignore_check_ = local_480.ignore_check_;
  local_4d8._9_7_ = local_480._9_7_;
  bVar7 = core::operator>(&local_4c8,0);
  if ((bVar7) || (bVar7 = core::operator>(&local_598,0), bVar7)) {
    local_558._0_8_ = "cfdapi_transaction.cpp";
    local_558._8_4_ = 0x197;
    local_558._16_8_ = "FundRawTransaction";
    local_588 = (undefined1  [8])core::Amount::GetSatoshiValue(&local_4c8);
    core::logger::log<long&>
              ((CfdSourceLocation *)local_558,kCfdLogLevelInfo,
               "FundRawTransaction:CoinSelection: target_amount=[{}]",(long *)local_588);
    CoinSelection::CoinSelection((CoinSelection *)local_558);
    CoinSelection::SelectCoins
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_588,(CoinSelection *)local_558
               ,&local_4c8,&local_398,&local_46c,&local_358,&local_598,&local_4d8,(Amount *)0x0,
               (bool *)0x0);
    auVar16 = local_588;
    local_5a8 = (value_type *)CONCAT44(uStack_57c,local_580);
    core::Amount::operator+=(&local_4d8,&local_480);
    local_588 = (undefined1  [8])0x5f123d;
    local_580 = 0x19f;
    local_578._0_8_ = "FundRawTransaction";
    local_468._0_8_ = core::Amount::GetSatoshiValue(&local_4d8);
    core::logger::log<long&>
              ((CfdSourceLocation *)local_588,kCfdLogLevelInfo,
               "FundRawTransaction: txin_total_amount=[{}]",(long *)local_468);
    bVar7 = core::operator<(&local_4d8,&local_4c8);
    if (bVar7) {
      local_588 = (undefined1  [8])0x5f123d;
      local_580 = 0x1a2;
      local_578._0_8_ = "FundRawTransaction";
      core::logger::log<>((CfdSourceLocation *)local_588,kCfdLogLevelWarning,
                          "Failed to FundRawTransaction. low BTC.");
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      local_588 = (undefined1  [8])local_578;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"low BTC.","");
      core::CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_588);
      __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if ((AbstractTransaction *)local_558._8_8_ != (AbstractTransaction *)0x0) {
      operator_delete((void *)local_558._8_8_);
      local_558._8_8_ = (AbstractTransaction *)0x0;
      local_558._16_8_ = local_558._16_8_ & 0xffffffff00000000;
      local_558._24_8_ = (_Bit_type *)0x0;
      local_538 = 0;
      local_530 = (pointer)0x0;
    }
  }
  else {
    local_5a8 = (value_type *)0x0;
    auVar16 = (undefined1  [8])0x0;
  }
  AVar17 = CoinSelectionOption::GetDustFeeAmount(&local_358,(Address *)local_2d8);
  local_3e8.amount_ = AVar17.amount_;
  local_3e8.ignore_check_ = AVar17.ignore_check_;
  local_558._0_8_ = "cfdapi_transaction.cpp";
  local_558._8_4_ = 0x1aa;
  local_558._16_8_ = "FundRawTransaction";
  local_588 = (undefined1  [8])core::Amount::GetSatoshiValue(&local_3e8);
  core::logger::log<long&>
            ((CfdSourceLocation *)local_558,kCfdLogLevelInfo,"FundRawTransaction: dust_amount=[{}]",
             (long *)local_588);
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x20;
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  AVar17 = core::operator-(&local_4d8,&local_490);
  local_4a0.amount_ = AVar17.amount_;
  local_4a0.ignore_check_ = AVar17.ignore_check_;
  local_500 = (pointer)core::Amount::GetSatoshiValue(&local_4a0);
  uVar10 = CoinSelectionOption::GetEffectiveFeeBaserate(&local_358);
  if (uVar10 != 0) {
    AVar17 = core::operator+(&local_490,&local_598);
    local_3c0.amount_ = AVar17.amount_;
    local_3c0.ignore_check_ = AVar17.ignore_check_;
    AVar17 = core::operator-(&local_4d8,&local_3e8);
    local_2e8.amount_ = AVar17.amount_;
    local_2e8.ignore_check_ = AVar17.ignore_check_;
    bVar7 = core::operator>(&local_2e8,&local_3c0);
    if (bVar7) {
      TransactionController::TransactionController((TransactionController *)local_558,local_4b0);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector(&local_3d8,&local_408);
      core::Txid::Txid((Txid *)local_588);
      if (auVar16 != (undefined1  [8])local_5a8) {
        pUVar13 = (pointer)auVar16;
        do {
          memcpy(local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,pUVar13->txid,
                 (long)local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
          core::ByteData256::ByteData256(&local_3b0,&local_4f8);
          core::Txid::Txid((Txid *)local_468,&local_3b0);
          core::Txid::operator=((Txid *)local_588,(Txid *)local_468);
          local_468._0_8_ = &PTR__Txid_00735400;
          if ((void *)CONCAT44(local_468._12_4_,local_468._8_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_468._12_4_,local_468._8_4_));
          }
          if (local_3b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3b0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          pUVar3 = local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            txid = &(local_438.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                     _M_impl.super__Vector_impl_data._M_start)->txid;
            do {
              bVar7 = core::Txid::Equals((Txid *)local_588,txid);
              if ((bVar7) && (pUVar13->vout == *(uint32_t *)&txid[1]._vptr_Txid)) {
                std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                          (&local_3d8,
                           (value_type *)
                           &txid[-2].data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                break;
              }
              pTVar4 = txid + 0x26;
              txid = (Txid *)&txid[0x27].data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
            } while ((pointer)&pTVar4->data_ != pUVar3);
          }
          pUVar13 = pUVar13 + 1;
        } while ((value_type *)pUVar13 != local_5a8);
      }
      TransactionController::AddTxOut
                (&local_110,(TransactionController *)local_558,(Address *)local_2d8,&local_598);
      local_110.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
           (_func_int **)&PTR__AbstractTxOutReference_007356f0;
      core::Script::~Script(&local_110.super_AbstractTxOutReference.locking_script_);
      __return_storage_ptr___00 = (string *)local_468;
      AbstractTransactionController::GetHex_abi_cxx11_
                (__return_storage_ptr___00,(AbstractTransactionController *)local_558);
      AVar17 = EstimateFee((TransactionApi *)__return_storage_ptr___00,(string *)local_468,
                           &local_3d8,(Amount *)0x0,(Amount *)0x0,local_508);
      local_598.amount_ = AVar17.amount_;
      local_598.ignore_check_ = AVar17.ignore_check_;
      if ((_func_int **)local_468._0_8_ != local_458) {
        operator_delete((void *)local_468._0_8_);
      }
      local_468._0_8_ = "cfdapi_transaction.cpp";
      local_468._8_4_ = 0x1cc;
      local_458[0] = (_func_int *)0x5f13a6;
      local_3b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)core::Amount::GetSatoshiValue(&local_598);
      core::logger::log<long&>
                ((CfdSourceLocation *)local_468,kCfdLogLevelInfo,"FundRawTransaction: new_fee={}",
                 (long *)&local_3b0);
      local_588 = (undefined1  [8])&PTR__Txid_00735400;
      if ((void *)CONCAT44(uStack_57c,local_580) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_57c,local_580));
      }
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_3d8);
      local_558._0_8_ = &PTR__TransactionController_00736ad0;
      core::Transaction::~Transaction((Transaction *)(local_558 + 0x10));
    }
    core::Amount::operator-=(&local_4a0,&local_598);
    local_500 = (pointer)core::Amount::GetSatoshiValue(&local_4a0);
    bVar7 = core::operator<(&local_4d8,&local_4a0);
    if (bVar7) {
      local_558._0_8_ = "cfdapi_transaction.cpp";
      local_558._8_4_ = 0x1d4;
      local_558._16_8_ = "FundRawTransaction";
      core::logger::log<>((CfdSourceLocation *)local_558,kCfdLogLevelWarning,
                          "Failed to FundRawTransaction. low fee.");
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      local_558._0_8_ = local_558 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,"Failed to FundRawTransaction. low fee.","");
      core::CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_558);
      __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (calculate_fee != (Amount *)0x0) {
      calculate_fee->ignore_check_ = local_598.ignore_check_;
      calculate_fee->amount_ = local_598.amount_;
    }
    bVar7 = core::operator>(&local_3e8,&local_4a0);
    if (bVar7) {
      local_500 = (pointer)0x0;
      AVar17 = core::operator-(&local_4d8,&local_4a0);
      local_598.amount_ = AVar17.amount_;
      local_598.ignore_check_ = AVar17.ignore_check_;
    }
    local_558._0_8_ = "cfdapi_transaction.cpp";
    local_558._8_4_ = 0x1e2;
    local_558._16_8_ = "FundRawTransaction";
    core::logger::log<long&>
              ((CfdSourceLocation *)local_558,kCfdLogLevelInfo,
               "FundRawTransaction: new_txout_amount={}",(long *)&local_500);
  }
  if ((local_500 != (pointer)0x0) && (bVar7 = core::operator<(&local_3e8,&local_4a0), bVar7)) {
    TransactionController::AddTxOut
              (&local_160,(TransactionController *)local_578._24_8_,(Address *)local_2d8,&local_4a0)
    ;
    local_160.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
         (_func_int **)&PTR__AbstractTxOutReference_007356f0;
    core::Script::~Script(&local_160.super_AbstractTxOutReference.locking_script_);
    local_558._0_8_ = "cfdapi_transaction.cpp";
    local_558._8_4_ = 0x1eb;
    local_558._16_8_ = "FundRawTransaction";
    local_588 = (undefined1  [8])core::Amount::GetSatoshiValue(&local_448);
    core::logger::log<long&>
              ((CfdSourceLocation *)local_558,kCfdLogLevelInfo,
               "FundRawTransaction:AddTxOut: value=[{}]",(long *)local_588);
    if (append_txout_addresses !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(append_txout_addresses,reserve_txout_address);
    }
  }
  if (estimate_fee != (Amount *)0x0) {
    estimate_fee->ignore_check_ = local_598.ignore_check_;
    estimate_fee->amount_ = local_598.amount_;
  }
  if (auVar16 != (undefined1  [8])local_5a8) {
    pUVar13 = (pointer)auVar16;
    do {
      memcpy(local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pUVar13->txid,
             (long)local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      core::ByteData256::ByteData256((ByteData256 *)local_588,&local_4f8);
      core::Txid::Txid((Txid *)local_558,(ByteData256 *)local_588);
      TransactionController::AddTxIn
                ((TxInReference *)&local_c0,(TransactionController *)local_578._24_8_,
                 (Txid *)local_558,pUVar13->vout);
      core::AbstractTxInReference::~AbstractTxInReference(&local_c0);
      local_558._0_8_ = &PTR__Txid_00735400;
      if ((AbstractTransaction *)local_558._8_8_ != (AbstractTransaction *)0x0) {
        operator_delete((void *)local_558._8_8_);
      }
      if (local_588 != (undefined1  [8])0x0) {
        operator_delete((void *)local_588);
      }
      pUVar13 = pUVar13 + 1;
    } while ((value_type *)pUVar13 != local_5a8);
  }
  if (local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (auVar16 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar16);
  }
  if (local_398.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_438);
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            (&local_420);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_408);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_190);
  core::Script::~Script(&local_1d0);
  local_260._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1e8);
  core::TapBranch::~TapBranch(&local_260);
  if (local_278 != (pointer)0x0) {
    operator_delete(local_278);
  }
  if ((pointer)local_2b8.map_._M_t._M_impl.super__Rb_tree_header._M_node_count != (pointer)0x0) {
    operator_delete((void *)local_2b8.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  if (local_2b8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    operator_delete(local_2b8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  if ((AddressFormatData *)local_2d8._16_8_ != &local_2b8) {
    operator_delete((void *)local_2d8._16_8_);
  }
  local_380._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_380.prefix_list_);
  local_358.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_358.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (TransactionController *)local_578._24_8_;
}

Assistant:

TransactionController TransactionApi::FundRawTransaction(
    const std::string& tx_hex, const std::vector<UtxoData>& utxos,
    const Amount& target_value,
    const std::vector<UtxoData>& selected_txin_utxos,
    const std::string& reserve_txout_address, double effective_fee_rate,
    Amount* estimate_fee, const UtxoFilter* filter,
    const CoinSelectionOption* option_params,
    std::vector<std::string>* append_txout_addresses, NetType net_type,
    const std::vector<AddressFormatData>* prefix_list,
    Amount* calculate_fee) const {
  // set option
  CoinSelectionOption option;
  UtxoFilter utxo_filter;
  if (filter) utxo_filter = *filter;
  if (option_params) {
    option = *option_params;
  } else {
    option.InitializeTxSizeInfo();
    option.SetEffectiveFeeBaserate(effective_fee_rate);
    option.SetLongTermFeeBaserate(effective_fee_rate);
  }

  AddressFactory addr_factory(net_type);
  if (prefix_list) {
    addr_factory = AddressFactory(net_type, *prefix_list);
  }
  Address reserve_address = addr_factory.GetAddress(reserve_txout_address);
  // FIXME(fujita-cg): AddressFactory::GetAddress()でチェックをしたいが、
  //   影響範囲が大きいためAPIでチェックを実行
  if (!addr_factory.CheckAddressNetType(reserve_address, net_type)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to FundRawTransaction. "
        "Input address and network is unmatch."
        ": address=[{}], input_net_type=[{}], parsed_net_type=[{}]",
        reserve_txout_address, net_type, reserve_address.GetNetType());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to FundRawTransaction. "
        "Input address and network is unmatch.");
  }

  // txから設定済みTxIn/TxOutの額を収集
  // (selected_txin_utxos指定分はtxid一致なら設定済みUTXO扱い)
  TransactionController txc(tx_hex);
  const Transaction& tx = txc.GetTransaction();
  Amount txin_amount;
  Amount txout_amount;
  for (const auto& txout : tx.GetTxOutList()) {
    txout_amount += txout.GetValue();
  }
  std::vector<UtxoData> matched_txin_utxos;
  matched_txin_utxos.reserve(selected_txin_utxos.size());
  const auto& txin_list = tx.GetTxInList();
  for (const auto& utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(utxo.txid)) &&
          (utxo.vout == txin.GetVout())) {
        txin_amount += utxo.amount;
        matched_txin_utxos.push_back(utxo);
        break;
      }
    }
  }

  std::vector<UtxoData> utxodata_list;
  utxodata_list.reserve(utxos.size());
  for (const auto& utxo : utxos) {
    bool isFind = false;
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(utxo.txid)) &&
          (utxo.vout == txin.GetVout())) {
        isFind = true;
        break;
      }
    }
    if (!isFind) {
      utxodata_list.push_back(utxo);
    }
  }

  Amount fee;
  if (option.GetEffectiveFeeBaserate() != 0) {
    fee = EstimateFee(
        tx_hex, matched_txin_utxos, nullptr, nullptr, effective_fee_rate);
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: pre estimation fee=[{}]",
        fee.GetSatoshiValue());
  }

  Amount diff_amount = Amount();        // difference between input and output
  Amount target_amount = target_value;  // selection require amount
  if (txin_amount > txout_amount) {
    // txinの余剰分を計算
    diff_amount = txin_amount - txout_amount;
    if (diff_amount < target_amount) {
      // txinの余剰分でtarget分が満たされない場合、満たされない分をコインセレクト
      target_amount -= diff_amount;
    }
  } else if (txin_amount < txout_amount) {
    // txoutの不足分を計算
    diff_amount = txout_amount - txin_amount;
    // txoutの不足分を合わせてコインセレクト
    target_amount += diff_amount;
  }

  // execute coinselection
  std::vector<Utxo> utxo_list = UtxoUtil::ConvertToUtxo(utxodata_list);
  Amount txin_total_amount = txin_amount;
  std::vector<Utxo> selected_coins;
  if (target_amount > 0 || fee > 0) {
    info(
        CFD_LOG_SOURCE, "FundRawTransaction:CoinSelection: target_amount=[{}]",
        target_amount.GetSatoshiValue());
    CoinSelection coin_select;
    selected_coins = coin_select.SelectCoins(
        target_amount, utxo_list, utxo_filter, option, fee, &txin_total_amount,
        nullptr, nullptr);
    txin_total_amount += txin_amount;
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: txin_total_amount=[{}]",
        txin_total_amount.GetSatoshiValue());
    if (txin_total_amount < target_amount) {
      warn(CFD_LOG_SOURCE, "Failed to FundRawTransaction. low BTC.");
      throw CfdException(CfdError::kCfdIllegalArgumentError, "low BTC.");
    }
  }

  // dust_amountを計算
  Amount dust_amount = option.GetDustFeeAmount(reserve_address);
  info(
      CFD_LOG_SOURCE, "FundRawTransaction: dust_amount=[{}]",
      dust_amount.GetSatoshiValue());

  // txoutへの追加
  std::vector<uint8_t> txid_bytes(cfd::core::kByteData256Length);
  Amount new_txout_amount =
      txin_total_amount -
      txout_amount;  // diff_amount: selected + txin - txout = new txout amount
  int64_t new_txout_satoshi = new_txout_amount.GetSatoshiValue();
  // feeを考慮する場合、追加後のTxInが既存のTxOut額以上ある場合、TxOutが追加されるのでfeeを再計算
  if (option.GetEffectiveFeeBaserate() > 0) {
    Amount need_amount = txout_amount + fee;
    Amount check_amount = txin_total_amount - dust_amount;
    if (check_amount > need_amount) {
      // dummyのtx作成
      TransactionController txc_dummy(tx_hex);
      std::vector<UtxoData> new_selected_utxos = matched_txin_utxos;
      Txid txid;
      for (const Utxo& coin : selected_coins) {
        memcpy(txid_bytes.data(), coin.txid, txid_bytes.size());
        txid = Txid(ByteData256(txid_bytes));
        for (const UtxoData& utxo : utxodata_list) {
          if (txid.Equals(utxo.txid) && (coin.vout == utxo.vout)) {
            new_selected_utxos.push_back(utxo);
            break;
          }
        }
      }
      // ダミーへの追加のため額はfeeで代替
      txc_dummy.AddTxOut(reserve_address, fee);
      fee = EstimateFee(
          txc_dummy.GetHex(), new_selected_utxos, nullptr, nullptr,
          effective_fee_rate);
      info(
          CFD_LOG_SOURCE, "FundRawTransaction: new_fee={}",
          fee.GetSatoshiValue());
    }

    new_txout_amount -= fee;  // txoutの追加額からfee分を除外
    new_txout_satoshi = new_txout_amount.GetSatoshiValue();

    if (txin_total_amount < new_txout_amount) {
      warn(CFD_LOG_SOURCE, "Failed to FundRawTransaction. low fee.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to FundRawTransaction. low fee.");
    }

    if (calculate_fee != nullptr) *calculate_fee = fee;
    // optionで、超過額の設定がある場合、余剰分をfeeに設定。
    if (dust_amount > new_txout_amount) {
      // feeに残高をすべて設定
      new_txout_satoshi = 0;
      fee = txin_total_amount - new_txout_amount;
    }
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: new_txout_amount={}",
        new_txout_satoshi);
  }

  // dustより小さい場合はTxOutには追加しない
  // (fee計算ありの場合はチェック済だが、fee計算なしの場合は未チェックのため)
  if ((new_txout_satoshi != 0) && (dust_amount < new_txout_amount)) {
    txc.AddTxOut(reserve_address, new_txout_amount);
    info(
        CFD_LOG_SOURCE, "FundRawTransaction:AddTxOut: value=[{}]",
        diff_amount.GetSatoshiValue());
    if (append_txout_addresses) {
      append_txout_addresses->push_back(reserve_txout_address);
    }
  }
  if (estimate_fee) *estimate_fee = fee;

  // SelectしたUTXOをTxInに設定
  for (auto& utxo : selected_coins) {
    memcpy(txid_bytes.data(), utxo.txid, txid_bytes.size());
    txc.AddTxIn(Txid(ByteData256(txid_bytes)), utxo.vout);
  }

  return txc;
}